

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

void array_container_grow(array_container_t *container,int32_t min,_Bool preserve)

{
  uint uVar1;
  uint16_t *puVar2;
  uint16_t *puVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = 0x1000;
  if (0x1000 < min) {
    uVar5 = 0x10000;
  }
  uVar1 = container->capacity;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  else if (uVar1 < 0x40) {
    uVar1 = uVar1 * 2;
  }
  else {
    if (uVar1 < 0x400) {
      uVar4 = uVar1 >> 1;
    }
    else {
      uVar4 = uVar1 >> 2;
    }
    uVar1 = uVar1 + uVar4;
  }
  if (uVar1 < uVar5) {
    uVar5 = uVar1;
  }
  if ((int)uVar1 < min) {
    uVar5 = min;
  }
  container->capacity = uVar5;
  puVar3 = container->array;
  if (preserve) {
    puVar2 = (uint16_t *)roaring_realloc(puVar3,(ulong)(uVar5 * 2));
    container->array = puVar2;
    if (puVar2 == (uint16_t *)0x0) {
      roaring_free(puVar3);
      return;
    }
  }
  else {
    roaring_free(puVar3);
    puVar3 = (uint16_t *)roaring_malloc((ulong)(uVar5 * 2));
    container->array = puVar3;
  }
  return;
}

Assistant:

void array_container_grow(array_container_t *container, int32_t min,
                          bool preserve) {
    int32_t max = (min <= DEFAULT_MAX_SIZE ? DEFAULT_MAX_SIZE : 65536);
    int32_t new_capacity = clamp(grow_capacity(container->capacity), min, max);

    container->capacity = new_capacity;
    uint16_t *array = container->array;

    if (preserve) {
        container->array =
            (uint16_t *)roaring_realloc(array, new_capacity * sizeof(uint16_t));
        if (container->array == NULL) roaring_free(array);
    } else {
        roaring_free(array);
        container->array =
            (uint16_t *)roaring_malloc(new_capacity * sizeof(uint16_t));
    }

    // if realloc fails, we have container->array == NULL.
}